

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormatSymbols::getConstSymbol(DecimalFormatSymbols *this,ENumberFormatSymbol symbol)

{
  UnicodeString *local_20;
  UnicodeString *strPtr;
  ENumberFormatSymbol symbol_local;
  DecimalFormatSymbols *this_local;
  
  if ((int)symbol < 0x1c) {
    local_20 = (UnicodeString *)(&this->field_0x8 + (ulong)symbol * 0x40);
  }
  else {
    local_20 = &this->fNoSymbol;
  }
  return local_20;
}

Assistant:

inline const UnicodeString &
DecimalFormatSymbols::getConstSymbol(ENumberFormatSymbol symbol) const {
    const UnicodeString *strPtr;
    if(symbol < kFormatSymbolCount) {
        strPtr = &fSymbols[symbol];
    } else {
        strPtr = &fNoSymbol;
    }
    return *strPtr;
}